

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

int Pdr_SetCompare(Pdr_Set_t **pp1,Pdr_Set_t **pp2)

{
  Pdr_Set_t *pPVar1;
  Pdr_Set_t *pPVar2;
  bool bVar3;
  int local_34;
  int i;
  Pdr_Set_t *p2;
  Pdr_Set_t *p1;
  Pdr_Set_t **pp2_local;
  Pdr_Set_t **pp1_local;
  
  pPVar1 = *pp1;
  pPVar2 = *pp2;
  local_34 = 0;
  while( true ) {
    bVar3 = false;
    if (local_34 < pPVar1->nLits) {
      bVar3 = local_34 < pPVar2->nLits;
    }
    if (!bVar3) break;
    if (*(int *)(&pPVar2->field_0x14 + (long)local_34 * 4) <
        *(int *)(&pPVar1->field_0x14 + (long)local_34 * 4)) {
      return -1;
    }
    if (*(int *)(&pPVar1->field_0x14 + (long)local_34 * 4) <
        *(int *)(&pPVar2->field_0x14 + (long)local_34 * 4)) {
      return 1;
    }
    local_34 = local_34 + 1;
  }
  if ((local_34 == pPVar1->nLits) && (local_34 < pPVar2->nLits)) {
    return -1;
  }
  if ((local_34 < pPVar1->nLits) && (local_34 == pPVar2->nLits)) {
    return 1;
  }
  return 0;
}

Assistant:

int Pdr_SetCompare( Pdr_Set_t ** pp1, Pdr_Set_t ** pp2 )
{
    Pdr_Set_t * p1 = *pp1;
    Pdr_Set_t * p2 = *pp2;
    int i;
    for ( i = 0; i < p1->nLits && i < p2->nLits; i++ )
    {
        if ( p1->Lits[i] > p2->Lits[i] )
            return -1;
        if ( p1->Lits[i] < p2->Lits[i] )
            return 1;
    }
    if ( i == p1->nLits && i < p2->nLits )
        return -1;
    if ( i < p1->nLits && i == p2->nLits )
        return 1;
    return 0;
}